

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

String * __thiscall
kj::anon_unknown_30::SocketAddress::toString(String *__return_storage_ptr__,SocketAddress *this)

{
  sa_family_t sVar1;
  ushort uVar2;
  char *pcVar3;
  uint *in_RCX;
  char (*in_R8) [2];
  unsigned_short *in_R9;
  Fault f;
  char buffer [46];
  Fault local_60;
  undefined1 local_58 [16];
  char *local_48;
  undefined8 local_40;
  
  local_58._2_14_ = local_58._8_14_;
  if (this->wildcard == true) {
    sVar1 = (this->addr).generic.sa_family;
    if ((sVar1 == 10) || (sVar1 == 2)) {
      uVar2 = (this->addr).inet4.sin_port;
      uVar2 = uVar2 << 8 | uVar2 >> 8;
    }
    else {
      uVar2 = 0;
    }
    local_48 = (char *)CONCAT44((int)((ulong)local_48 >> 0x20),(uint)uVar2);
    str<char_const(&)[3],unsigned_int>
              (__return_storage_ptr__,(kj *)"*:",(char (*) [3])&local_48,in_RCX);
  }
  else {
    uVar2 = (this->addr).generic.sa_family;
    if (uVar2 == 1) {
      local_58 = (undefined1  [16])kj::_::safeUnixPath(&(this->addr).unixDomain,this->addrlen);
      pcVar3 = local_58._0_8_;
      if ((local_58._8_8_ == 0) || (*pcVar3 != '\0')) {
        local_48 = "unix:";
        local_40 = 5;
      }
      else {
        local_58._8_8_ = local_58._8_8_ - 1;
        local_58._0_8_ = pcVar3 + 1;
        local_48 = "unix-abstract:";
        local_40 = 0xe;
      }
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                (__return_storage_ptr__,(_ *)&local_48,(ArrayPtr<const_char> *)local_58,
                 (ArrayPtr<const_char> *)local_58);
    }
    else {
      if (uVar2 == 10) {
        pcVar3 = inet_ntop((uint)uVar2,(void *)((long)&this->addr + 8),(char *)&local_48,0x2e);
        if (pcVar3 != (char *)0x0) {
          local_60.exception._0_1_ = 0x5b;
          uVar2 = (this->addr).inet4.sin_port;
          local_58._0_2_ = uVar2 << 8 | uVar2 >> 8;
          str<char,char(&)[46],char_const(&)[3],unsigned_short>
                    (__return_storage_ptr__,(kj *)&local_60,(char *)&local_48,(char (*) [46])"]:",
                     (char (*) [3])local_58,in_R9);
          return __return_storage_ptr__;
        }
        __errno_location();
      }
      else {
        if (uVar2 != 2) {
          str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
                    (__return_storage_ptr__,(kj *)"(unknown address family ",
                     (char (*) [25])&this->addr,(unsigned_short *)0x4f4250,in_R8);
          return __return_storage_ptr__;
        }
        pcVar3 = inet_ntop(2,(void *)((long)&this->addr + 4),(char *)&local_48,0x2e);
        if (pcVar3 != (char *)0x0) {
          local_60.exception._0_1_ = 0x3a;
          uVar2 = (this->addr).inet4.sin_port;
          local_58._0_2_ = uVar2 << 8 | uVar2 >> 8;
          str<char(&)[46],char,unsigned_short>
                    (__return_storage_ptr__,(kj *)&local_48,(char (*) [46])&local_60,local_58,
                     (unsigned_short *)in_R8);
          return __return_storage_ptr__;
        }
        __errno_location();
      }
      local_58 = ZEXT816(0);
      local_60.exception = (Exception *)0x0;
      kj::_::Debug::Fault::init
                (&local_60,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_60);
      heapString(__return_storage_ptr__,"(inet_ntop error)",0x11);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String toString() const {
    if (wildcard) {
      return str("*:", getPort());
    }

    switch (addr.generic.sa_family) {
      case AF_INET: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet4.sin_family, &addr.inet4.sin_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str(buffer, ':', ntohs(addr.inet4.sin_port));
      }
      case AF_INET6: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet6.sin6_family, &addr.inet6.sin6_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str('[', buffer, "]:", ntohs(addr.inet6.sin6_port));
      }
      case AF_UNIX: {
        auto path = _::safeUnixPath(&addr.unixDomain, addrlen);
        if (path.size() > 0 && path[0] == '\0') {
          return str("unix-abstract:", path.slice(1, path.size()));
        } else {
          return str("unix:", path);
        }
      }
      default:
        return str("(unknown address family ", addr.generic.sa_family, ")");
    }
  }